

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O3

Var Js::TypedArrayBase::CommonSet(Arguments *args)

{
  ScriptContext *scriptContext;
  bool bVar1;
  uint uVar2;
  uint32 offset;
  BOOL BVar3;
  RecyclableObject *in_RAX;
  Var pvVar4;
  TypedArrayBase *this;
  TypedArrayBase *source;
  JavascriptCopyOnAccessNativeIntArray *this_00;
  RecyclableObject *local_38;
  RecyclableObject *sourceArray;
  
  offset = 0;
  local_38 = in_RAX;
  pvVar4 = Arguments::operator[](args,0);
  this = VarTo<Js::TypedArrayBase>(pvVar4);
  scriptContext =
       (((((this->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
           super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  uVar2 = *(uint *)&args->Info & 0xffffff;
  if (1 < uVar2) {
    if (uVar2 != 2) {
      pvVar4 = Arguments::operator[](args,2);
      offset = ArrayBuffer::ToIndex(pvVar4,-0x7ff5ec24,scriptContext,0x7fffffff,false);
    }
    pvVar4 = Arguments::operator[](args,1);
    bVar1 = VarIs<Js::TypedArrayBase>(pvVar4);
    if (bVar1) {
      source = UnsafeVarTo<Js::TypedArrayBase>(pvVar4);
      if (source != (TypedArrayBase *)0x0) {
        if ((((source->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached != false) ||
           (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true))
        goto LAB_00d58dd5;
        Set(this,source,offset);
        goto LAB_00d58dac;
      }
    }
    pvVar4 = Arguments::operator[](args,1);
    if (pvVar4 != (Var)0x0) {
      bVar1 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar4);
      if (bVar1) {
        this_00 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pvVar4);
        if (this_00 != (JavascriptCopyOnAccessNativeIntArray *)0x0) {
          JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(this_00);
        }
      }
    }
    pvVar4 = Arguments::operator[](args,1);
    BVar3 = JavascriptConversion::ToObject(pvVar4,scriptContext,&local_38);
    if (BVar3 != 0) {
      if (((this->super_ArrayBufferParent).arrayBuffer.ptr)->isDetached == true) {
LAB_00d58dd5:
        JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,L"[TypedArray].prototype.set");
      }
      SetObject(this,local_38,(this->super_ArrayBufferParent).super_ArrayObject.length,offset);
LAB_00d58dac:
      return (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
    }
  }
  JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec22,(PCWSTR)0x0);
}

Assistant:

Var TypedArrayBase::CommonSet(Arguments& args)
    {
        TypedArrayBase* typedArrayBase = VarTo<TypedArrayBase>(args[0]);
        ScriptContext* scriptContext = typedArrayBase->GetScriptContext();
        uint32 offset = 0;
        if (args.Info.Count < 2)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_TypedArray_NeedSource);
        }

        if (args.Info.Count > 2)
        {
            offset = ArrayBuffer::ToIndex(args[2], JSERR_InvalidTypedArrayLength, scriptContext, ArrayBuffer::MaxArrayBufferLength, false);
        }

        TypedArrayBase* typedArraySource = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(args[1]);
        if (typedArraySource)
        {
            if (typedArraySource->IsDetachedBuffer() || typedArrayBase->IsDetachedBuffer()) // If IsDetachedBuffer(targetBuffer) is true, then throw a TypeError exception.
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("[TypedArray].prototype.set"));
            }
            typedArrayBase->Set(typedArraySource, (uint32)offset);
        }
        else
        {
            RecyclableObject* sourceArray;
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(args[1]);
#endif
            if (!JavascriptConversion::ToObject(args[1], scriptContext, &sourceArray))
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_TypedArray_NeedSource);
            }
            else if (typedArrayBase->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("[TypedArray].prototype.set"));
            }
            typedArrayBase->SetObject(sourceArray, typedArrayBase->GetLength(), (uint32)offset);
        }
        return scriptContext->GetLibrary()->GetUndefined();
    }